

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

char * glu::getGLSLVersionDeclaration(GLSLVersion version)

{
  char **ppcVar1;
  GLSLVersion version_local;
  
  ppcVar1 = de::getSizedArrayElement<14,14,char_const*>(&getGLSLVersionDeclaration::s_decl,version);
  return *ppcVar1;
}

Assistant:

const char* getGLSLVersionDeclaration (GLSLVersion version)
{
	static const char* s_decl[] =
	{
		"#version 100",
		"#version 300 es",
		"#version 310 es",
		"#version 320 es",
		"#version 130",
		"#version 140",
		"#version 150",
		"#version 330",
		"#version 400",
		"#version 410",
		"#version 420",
		"#version 430",
		"#version 440",
		"#version 450",
	};

	return de::getSizedArrayElement<GLSL_VERSION_LAST>(s_decl, version);
}